

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_imrecv_(void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *message,
                   MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *request_local;
  MPIABI_Fint *message_local;
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *count_local;
  void *buf_local;
  
  mpi_imrecv_(buf,count,datatype,message,request,ierror);
  return;
}

Assistant:

void mpiabi_imrecv_(
  void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  MPIABI_Fint * message,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_imrecv_(
    buf,
    count,
    datatype,
    message,
    request,
    ierror
  );
}